

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void ClipperLib::RangeTest(IntPoint *Pt,bool *useFullRange)

{
  long lVar1;
  clipperException *this;
  
  lVar1 = Pt->X;
  if ((*useFullRange & 1U) == 0) {
    if (((lVar1 < 0x40000000) && (-0x40000000 < lVar1)) &&
       (0xffffffff80000000 < Pt->Y - 0x40000000U)) {
      return;
    }
    *useFullRange = true;
  }
  if (((lVar1 < 0x4000000000000000) && (-0x4000000000000000 < lVar1)) &&
     (0x8000000000000000 < Pt->Y + 0xc000000000000000U)) {
    return;
  }
  this = (clipperException *)__cxa_allocate_exception(0x28);
  clipperException::clipperException(this,"Coordinate outside allowed range");
  __cxa_throw(this,&clipperException::typeinfo,clipperException::~clipperException);
}

Assistant:

void RangeTest(const IntPoint& Pt, bool& useFullRange)
{
  if (useFullRange)
  {
    if (Pt.X > hiRange || Pt.Y > hiRange || -Pt.X > hiRange || -Pt.Y > hiRange) 
      throw clipperException("Coordinate outside allowed range");
  }
  else if (Pt.X > loRange|| Pt.Y > loRange || -Pt.X > loRange || -Pt.Y > loRange) 
  {
    useFullRange = true;
    RangeTest(Pt, useFullRange);
  }
}